

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O3

int32_t __thiscall
icu_63::CollationBuilder::findOrInsertNodeForPrimary
          (CollationBuilder *this,uint32_t p,UErrorCode *errorCode)

{
  uint uVar1;
  int elem;
  int32_t *piVar2;
  UBool UVar3;
  int64_t *piVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint32_t uVar9;
  bool bVar10;
  
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  uVar1 = (this->rootPrimaryIndexes).count;
  piVar4 = (this->nodes).elements;
  if (uVar1 == 0) {
    uVar6 = 0xffffffff;
  }
  else {
    piVar2 = (this->rootPrimaryIndexes).elements;
    uVar6 = (int)uVar1 / 2;
    uVar9 = *(uint32_t *)((long)piVar4 + (long)piVar2[(int)uVar6] * 8 + 4);
    if (uVar9 != p) {
      uVar7 = 0;
      uVar8 = uVar1;
      do {
        if (p < uVar9) {
          uVar8 = uVar6;
          if (uVar6 == uVar7) {
            uVar6 = ~uVar6;
            break;
          }
        }
        else {
          bVar10 = uVar6 == uVar7;
          uVar7 = uVar6;
          if (bVar10) {
            uVar6 = -uVar6 - 2;
            break;
          }
        }
        uVar6 = (int)(uVar7 + uVar8) / 2;
        uVar9 = *(uint32_t *)((long)piVar4 + (long)piVar2[(int)uVar6] * 8 + 4);
      } while (uVar9 != p);
    }
    if (-1 < (int)uVar6) {
      if ((int)uVar1 <= (int)uVar6) {
        return 0;
      }
      return piVar2[uVar6];
    }
  }
  elem = (this->nodes).count;
  if ((elem < -1) || (iVar5 = elem, (this->nodes).capacity <= elem)) {
    UVar3 = UVector64::expandCapacity(&this->nodes,elem + 1,errorCode);
    if (UVar3 == '\0') goto LAB_0023da45;
    iVar5 = (this->nodes).count;
    piVar4 = (this->nodes).elements;
  }
  piVar4[iVar5] = (ulong)p << 0x20;
  (this->nodes).count = iVar5 + 1;
LAB_0023da45:
  UVector32::insertElementAt(&this->rootPrimaryIndexes,elem,~uVar6,errorCode);
  return elem;
}

Assistant:

int32_t
CollationBuilder::findOrInsertNodeForPrimary(uint32_t p, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }

    int32_t rootIndex = binarySearchForRootPrimaryNode(
        rootPrimaryIndexes.getBuffer(), rootPrimaryIndexes.size(), nodes.getBuffer(), p);
    if(rootIndex >= 0) {
        return rootPrimaryIndexes.elementAti(rootIndex);
    } else {
        // Start a new list of nodes with this primary.
        int32_t index = nodes.size();
        nodes.addElement(nodeFromWeight32(p), errorCode);
        rootPrimaryIndexes.insertElementAt(index, ~rootIndex, errorCode);
        return index;
    }
}